

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMHMixedHybridMeshControl.cpp
# Opt level: O1

void __thiscall
TPZMHMixedHybridMeshControl::CreateInternalFluxElements(TPZMHMixedHybridMeshControl *this)

{
  _Rb_tree_header *p_Var1;
  TPZGeoMesh *this_00;
  long lVar2;
  long lVar3;
  TPZGeoEl *gel;
  long lVar4;
  int iVar5;
  mapped_type *this_01;
  TPZGeoEl **ppTVar6;
  TPZCompEl *cel;
  _Base_ptr p_Var7;
  _Self __tmp;
  long nelem;
  TPZCompMesh *cmeshHDiv;
  TPZCompMesh *local_38;
  
  this_00 = ((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fGMesh.fRef)->fPointer;
  iVar5 = this_00->fDim;
  local_38 = ((this->super_TPZMHMixedMeshControl).fFluxMesh.fRef)->fPointer;
  TPZGeoMesh::ResetReference(this_00);
  TPZCompMesh::LoadReferences(local_38);
  local_38->fDimModel = iVar5;
  TPZCreateApproximationSpace::SetAllCreateFunctionsHDiv(&local_38->fCreate,iVar5);
  local_38->fDefaultOrder =
       (this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fpOrderInternal;
  this_01 = std::
            map<TPZCompMesh_*,_TPZManVector<long,_10>,_std::less<TPZCompMesh_*>,_std::allocator<std::pair<TPZCompMesh_*const,_TPZManVector<long,_10>_>_>_>
            ::operator[](&(this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.
                          fConnectToSubDomainIdentifier,&local_38);
  TPZManVector<long,_10>::Expand(this_01,10000);
  p_Var7 = *(_Base_ptr *)
            ((long)&(this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fMHMtoSubCMesh._M_t.
                    _M_impl.super__Rb_tree_header._M_header + 0x10);
  p_Var1 = &(this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fMHMtoSubCMesh._M_t._M_impl.
            super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var1) {
    lVar2 = (((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fGMesh.fRef)->fPointer->
            fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>.fNElements;
    do {
      TPZGeoMesh::ResetReference
                (((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fGMesh.fRef)->fPointer)
      ;
      if (0 < lVar2) {
        lVar3 = *(long *)(p_Var7 + 1);
        nelem = 0;
        do {
          ppTVar6 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                              (&(((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fGMesh.
                                 fRef)->fPointer->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,
                               nelem);
          gel = *ppTVar6;
          if (gel != (TPZGeoEl *)0x0) {
            (**(code **)(*(long *)gel + 0x210))(gel);
            lVar4 = (this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fGeoToMHMDomain.
                    super_TPZVec<long>.fStore[nelem];
            iVar5 = (**(code **)(*(long *)gel + 0x210))(gel);
            if (iVar5 == ((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fGMesh.fRef)->
                         fPointer->fDim) {
              iVar5 = (**(code **)(*(long *)gel + 0x1d0))(gel);
              if ((iVar5 == 0) && (lVar4 == lVar3)) {
                cel = TPZCreateApproximationSpace::CreateCompEl(&local_38->fCreate,gel,local_38);
                TPZMHMeshControl::SetSubdomain
                          ((TPZMHMeshControl *)this,cel,*(int64_t *)(p_Var7 + 1));
              }
            }
          }
          nelem = nelem + 1;
        } while (lVar2 != nelem);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
  }
  TPZGeoMesh::ResetReference
            (((this->super_TPZMHMixedMeshControl).super_TPZMHMeshControl.fGMesh.fRef)->fPointer);
  (**(code **)(*(long *)((this->super_TPZMHMixedMeshControl).fFluxMesh.fRef)->fPointer + 0x60))();
  SplitFluxElementsAroundFractures(this);
  CreateHDivWrappers(this);
  return;
}

Assistant:

void TPZMHMixedHybridMeshControl::CreateInternalFluxElements()
{
    TPZGeoMesh *gmesh = fGMesh.operator->();
    int meshdim = gmesh->Dimension();
    TPZCompMesh * cmeshHDiv = fFluxMesh.operator->();
    gmesh->ResetReference();
    cmeshHDiv->LoadReferences();
    cmeshHDiv->SetDimModel(meshdim);
    cmeshHDiv->ApproxSpace().SetAllCreateFunctionsHDiv(meshdim);
    cmeshHDiv->SetDefaultOrder(fpOrderInternal);
    
    //Criar elementos computacionais malha MHM
    
    TPZGeoEl *gel = NULL;
    TPZGeoEl *gsubel = NULL;
    fConnectToSubDomainIdentifier[cmeshHDiv].Expand(10000);
    int64_t nel = fGMesh->NElements();
    
    for (auto it= this->fMHMtoSubCMesh.begin(); it != this->fMHMtoSubCMesh.end(); it++)
    {
        fGMesh->ResetReference();
        int64_t MHMIndex = it->first;
        for (int64_t el = 0; el< nel; el++) {
            TPZGeoEl *gel = fGMesh->Element(el);
            if(!gel) continue;
            int geldim = gel->Dimension();
            int64_t gelMHM = fGeoToMHMDomain[el];
            if(!gel || gel->Dimension() != fGMesh->Dimension() || gel->HasSubElement() || gelMHM != MHMIndex)
            {
                continue;
            }
            // create the flux element
            
            TPZCompEl *cel = cmeshHDiv->CreateCompEl(gel);
            /// associate the connects with the subdomain
            SetSubdomain(cel, it->first);
        }
    }
    
    fGMesh->ResetReference();    
    fFluxMesh->ExpandSolution();
    
    SplitFluxElementsAroundFractures();

    CreateHDivWrappers();
}